

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.hpp
# Opt level: O1

string * __thiscall
nkt::http::response::to_string_abi_cxx11_(string *__return_storage_ptr__,response *this)

{
  ostream *poVar1;
  _Hash_node_base *p_Var2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  ostringstream result;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"HTTP/1.0 ",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,this->_status_code);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->_status_message)._M_dataplus._M_p,
                      (this->_status_message)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  p_Var2 = (this->_headers)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair(&local_1e8,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(p_Var2 + 1));
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e8.first._M_dataplus._M_p,
                          local_1e8.first._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_1e8.second._M_dataplus._M_p,local_1e8.second._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.second._M_dataplus._M_p != &local_1e8.second.field_2) {
        operator_delete(local_1e8.second._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.first._M_dataplus._M_p != &local_1e8.first.field_2) {
        operator_delete(local_1e8.first._M_dataplus._M_p);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(this->_body)._M_dataplus._M_p,(this->_body)._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() {
        std::ostringstream result;
        result << "HTTP/1.0 " << _status_code << " " << _status_message << "\r\n";
        for (auto it : _headers) {
            result << it.first << ": " << it.second << "\r\n";
        }
        result << "\r\n" << _body;
        return result.str();
    }